

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::Triangle::computeCentroid(Vector3d *__return_storage_ptr__,Triangle *this)

{
  Vector<double,_3U> VStack_68;
  Vector<double,_3U> local_50;
  Vector<double,_3U> local_38;
  
  this->HaveCentroid_ = true;
  operator+(&VStack_68,&this->vertices_[0].super_Vector<double,_3U>,
            &this->vertices_[1].super_Vector<double,_3U>);
  operator+(&local_50,&VStack_68,&this->vertices_[2].super_Vector<double,_3U>);
  operator/(&local_38,&local_50,3.0);
  Vector3<double>::operator=(&this->centroid_,&local_38);
  Vector<double,_3U>::Vector
            (&__return_storage_ptr__->super_Vector<double,_3U>,
             &(this->centroid_).super_Vector<double,_3U>);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Triangle::computeCentroid() {
  HaveCentroid_ = true;
  centroid_     = (vertices_[0] + vertices_[1] + vertices_[2]) / RealType(3.0);
  return centroid_;
}